

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error T1_Set_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Error FVar1;
  
  FVar1 = t1_set_mm_blend((T1_Face)face->blend,num_coords,coords);
  if (FVar1 == 0) {
    (face->root).face_flags =
         (ulong)(num_coords != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error;


    error = t1_set_mm_blend( face, num_coords, coords );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }